

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *this;
  size_type sVar3;
  reference pvVar4;
  pointer pPVar5;
  reference pvVar6;
  pointer pdVar7;
  reference pvVar8;
  double dVar9;
  double lon;
  double lat;
  size_t idx_crd;
  size_t size_points;
  Polygon_topojson_t polygon;
  size_t idx_pol;
  size_t size_pol;
  Geometry_t geometry;
  size_t idx_geom;
  size_t size_geom;
  topology_object_t topology;
  size_t topology_index;
  undefined1 local_70 [8];
  topojson_t topojson;
  char **argv_local;
  int argc_local;
  
  topojson.idx_geom = (size_t)argv;
  if (argc < 2) {
    this = std::operator<<((ostream *)&std::cout,"usage : ./parser <GEOJSON file>");
    std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = 1;
  }
  else {
    topojson_t::topojson_t((topojson_t *)local_70);
    iVar2 = topojson_t::convert((topojson_t *)local_70,*(char **)(topojson.idx_geom + 8));
    if (iVar2 < 0) {
      argv_local._4_4_ = 1;
    }
    else {
      sVar3 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::size
                        ((vector<topology_object_t,_std::allocator<topology_object_t>_> *)local_70);
      if (sVar3 == 0) {
        argv_local._4_4_ = 0;
      }
      else {
        topology.m_geom.super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        topojson_t::make_coordinates((topojson_t *)local_70,0);
        pvVar4 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                           ((vector<topology_object_t,_std::allocator<topology_object_t>_> *)
                            local_70,(size_type)
                                     topology.m_geom.
                                     super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
        topology_object_t::topology_object_t((topology_object_t *)&size_geom,pvVar4);
        pPVar5 = (pointer)std::vector<Geometry_t,_std::allocator<Geometry_t>_>::size
                                    ((vector<Geometry_t,_std::allocator<Geometry_t>_> *)
                                     ((long)&topology.name.field_2 + 8));
        for (geometry.m_polygon.
             super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            geometry.m_polygon.
            super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage < pPVar5;
            geometry.m_polygon.
            super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 (pointer)((long)&((geometry.m_polygon.
                                    super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->arcs).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start + 1)) {
          pvVar6 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at
                             ((vector<Geometry_t,_std::allocator<Geometry_t>_> *)
                              ((long)&topology.name.field_2 + 8),
                              (size_type)
                              geometry.m_polygon.
                              super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage);
          Geometry_t::Geometry_t((Geometry_t *)&size_pol,pvVar6);
          bVar1 = is_polygon((Geometry_t *)&size_pol);
          if (bVar1) {
            pdVar7 = (pointer)std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::
                              size((vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                    *)((long)&geometry.type.field_2 + 8));
            for (polygon.m_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                polygon.m_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage < pdVar7;
                polygon.m_y.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage =
                     (pointer)((long)polygon.m_y.super__Vector_base<double,_std::allocator<double>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 1)) {
              pvVar8 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 ((vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_> *
                                  )((long)&geometry.type.field_2 + 8),
                                  (size_type)
                                  polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              Polygon_topojson_t::Polygon_topojson_t((Polygon_topojson_t *)&size_points,pvVar8);
              pvVar8 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 ((vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_> *
                                  )((long)&geometry.type.field_2 + 8),
                                  (size_type)
                                  polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              dVar9 = (double)std::vector<double,_std::allocator<double>_>::size(&pvVar8->m_y);
              for (lat = 0.0; (ulong)lat < (ulong)dVar9; lat = (double)((long)lat + 1)) {
                pvVar8 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                   ((vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                     *)((long)&geometry.type.field_2 + 8),
                                    (size_type)
                                    polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<double,_std::allocator<double>_>::at(&pvVar8->m_y,(size_type)lat);
                pvVar8 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                   ((vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                                     *)((long)&geometry.type.field_2 + 8),
                                    (size_type)
                                    polygon.m_y.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage);
                std::vector<double,_std::allocator<double>_>::at(&pvVar8->m_x,(size_type)lat);
              }
              Polygon_topojson_t::~Polygon_topojson_t((Polygon_topojson_t *)&size_points);
            }
          }
          Geometry_t::~Geometry_t((Geometry_t *)&size_pol);
        }
        argv_local._4_4_ = 0;
        topology_object_t::~topology_object_t((topology_object_t *)&size_geom);
      }
    }
    topojson_t::~topojson_t((topojson_t *)local_70);
  }
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 2)
  {
    std::cout << "usage : ./parser <GEOJSON file>" << std::endl;
    return 1;
  }

  topojson_t topojson;
  if (topojson.convert(argv[1]) < 0)
  {
    return 1;
  }

  //no objects
  if (!topojson.m_topology.size())
  {
    return 0;
  }

  /////////////////////////////////////////////////////////////////////////////////////////////////////
  //must make the coordinates for the topology first; assume the first topology
  /////////////////////////////////////////////////////////////////////////////////////////////////////

  size_t topology_index = 0;
  topojson.make_coordinates(topology_index);
  topology_object_t topology = topojson.m_topology.at(topology_index);

  size_t size_geom = topology.m_geom.size();
  for (size_t idx_geom = 0; idx_geom < size_geom; idx_geom++)
  {
    Geometry_t geometry = topology.m_geom.at(idx_geom);
    if (is_polygon(geometry))
    {
      size_t size_pol = geometry.m_polygon.size();
      for (size_t idx_pol = 0; idx_pol < size_pol; idx_pol++)
      {
        Polygon_topojson_t polygon = geometry.m_polygon.at(idx_pol);

        //render

        size_t size_points = geometry.m_polygon.at(idx_pol).m_y.size();
        for (size_t idx_crd = 0; idx_crd < size_points; idx_crd++)
        {
          double lat = geometry.m_polygon.at(idx_pol).m_y.at(idx_crd);
          double lon = geometry.m_polygon.at(idx_pol).m_x.at(idx_crd);
        }

      }
    }
  }

  return 0;
}